

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_sectors.cxx
# Opt level: O0

void __thiscall xray_re::xr_sector_object::save_v12(xr_sector_object *this,xr_ini_writer *w)

{
  void *__buf;
  size_t in_RCX;
  size_t __n;
  void *__buf_00;
  char *__buf_01;
  xr_ini_writer *w_local;
  xr_sector_object *this_local;
  
  xr_custom_object::save_v12(&this->super_xr_custom_object,w);
  xr_ini_writer::write(w,0x2e3379,(void *)0xff,in_RCX);
  xr_ini_writer::write(w,0x2e338b,__buf_00,in_RCX);
  __buf_01 = "off";
  if (this->m_private != '\0') {
    __buf_01 = "on";
  }
  __n = 1;
  xr_ini_writer::write(w,0x2d9ee9,__buf_01,1);
  xr_ini_writer::
  w_ini_seq<std::vector<xray_re::sector_item,std::allocator<xray_re::sector_item>>,write_ini_item>
            (w,&this->m_items);
  __buf = (void *)std::vector<xray_re::sector_item,_std::allocator<xray_re::sector_item>_>::size
                            (&this->m_items);
  xr_ini_writer::write(w,0x2e3398,__buf,__n);
  xr_ini_writer::write(w,0x2e4e39,(void *)0x12,__n);
  return;
}

Assistant:

void xr_sector_object::save_v12(xr_ini_writer* w) const
{
	xr_custom_object::save_v12(w);

	w->write("change_map_to_idx", 255);
	w->write("sector_color", this->m_color);
	w->write("default", this->m_private ? "on" : "off");

	w->w_ini_seq(this->m_items, write_ini_item());
	w->write("items_count", this->m_items.size());
	w->write("version", SECTOR_VERSION_V12);
}